

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_test.cpp
# Opt level: O2

void __thiscall unit_test::~unit_test(unit_test *this)

{
  ~unit_test(this);
  operator_delete(this);
  return;
}

Assistant:

~unit_test()
	{
		c_->dec();
	}